

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

TargetFrameSubDescriptor * __thiscall
ASDCP::MXF::TargetFrameSubDescriptor::WriteToTLVSet
          (TargetFrameSubDescriptor *this,TLVWriter *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *pMVar3;
  MDDEntry *pMVar4;
  MDDEntry *in_RDX;
  TLVWriter local_448;
  TLVWriter local_3e0;
  TLVWriter local_378;
  TLVWriter local_310;
  TLVWriter local_2a8;
  TLVWriter local_240;
  TLVWriter local_1d8;
  TLVWriter local_170;
  TLVWriter local_108;
  TLVWriter local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVWriter *TLVSet_local;
  TargetFrameSubDescriptor *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x11f2,
                  "virtual ASDCP::Result_t ASDCP::MXF::TargetFrameSubDescriptor::WriteToTLVSet(TLVWriter &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameAncillaryResourceID);
    TLVWriter::WriteObject(&local_a0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_MediaType);
    TLVWriter::WriteObject(&local_108,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameIndex);
    TLVWriter::WriteUi64(&local_170,pMVar4,(ui64_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameTransferCharacteristic);
    TLVWriter::WriteObject(&local_1d8,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameColorPrimaries);
    TLVWriter::WriteObject(&local_240,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameComponentMaxRef);
    TLVWriter::WriteUi32(&local_2a8,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_2a8);
    Kumu::Result_t::~Result_t((Result_t *)&local_2a8);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameComponentMinRef);
    TLVWriter::WriteUi32(&local_310,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_310);
    Kumu::Result_t::~Result_t((Result_t *)&local_310);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar4 = local_20;
  if (-1 < iVar2) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameEssenceStreamID);
    TLVWriter::WriteUi32(&local_378,pMVar4,(ui32_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_378);
    Kumu::Result_t::~Result_t((Result_t *)&local_378);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<Kumu::UUID>::empty
                        ((optional_property<Kumu::UUID> *)
                         &TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent), pMVar4 = local_20, !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_ACESPictureSubDescriptorInstanceID);
    optional_property<Kumu::UUID>::get
              ((optional_property<Kumu::UUID> *)
               &TLVSet[4].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    TLVWriter::WriteObject(&local_3e0,pMVar4,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_3e0);
    Kumu::Result_t::~Result_t((Result_t *)&local_3e0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<ASDCP::UL>::empty((optional_property<ASDCP::UL> *)(TLVSet + 5)),
     !bVar1)) {
    pMVar4 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameViewingEnvironment);
    optional_property<ASDCP::UL>::get((optional_property<ASDCP::UL> *)(TLVSet + 5));
    TLVWriter::WriteObject(&local_448,local_20,(IArchive *)pMVar4);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_448);
    Kumu::Result_t::~Result_t((Result_t *)&local_448);
  }
  return this;
}

Assistant:

ASDCP::Result_t
TargetFrameSubDescriptor::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameAncillaryResourceID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, MediaType));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi64(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameIndex));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameTransferCharacteristic));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameColorPrimaries));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameComponentMaxRef));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameComponentMinRef));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameEssenceStreamID));
  if ( ASDCP_SUCCESS(result)  && ! ACESPictureSubDescriptorInstanceID.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(TargetFrameSubDescriptor, ACESPictureSubDescriptorInstanceID));
  if ( ASDCP_SUCCESS(result)  && ! TargetFrameViewingEnvironment.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(TargetFrameSubDescriptor, TargetFrameViewingEnvironment));
  return result;
}